

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  CharFormat CVar1;
  char *str;
  ostream *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  CVar1 = PrintCharsAsStringTo<char>(unaff_retaddr,in_RDI,in_RSI);
  if ((CVar1 == kHexEscape) && ((FLAGS_gtest_print_utf8 & 1) != 0)) {
    str = (char *)std::__cxx11::string::data();
    std::__cxx11::string::size();
    anon_unknown_91::ConditionalPrintAsText(str,in_stack_ffffffffffffffd8,(ostream *)0x17fb35);
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}